

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

void __thiscall toml::serialization_error::~serialization_error(serialization_error *this)

{
  serialization_error *in_RDI;
  
  ~serialization_error(in_RDI);
  operator_delete(in_RDI,0xa0);
  return;
}

Assistant:

~serialization_error() noexcept override = default;